

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O2

int v_scroll_top_proc(Am_Object *self)

{
  Am_Widget_Look AVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object group;
  Am_Widget_Look look;
  Am_Object AStack_28;
  Am_Widget_Look local_1c;
  
  Am_Object::Get_Owner(&AStack_28,(Am_Slot_Flags)self);
  iVar2 = get_scroll_border_thickness(&AStack_28);
  pAVar4 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_1c,pAVar4);
  AVar1 = Am_MOTIF_LOOK;
  pAVar4 = Am_Object::Get(&AStack_28,0x1c0,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object(&AStack_28);
  return ((uint)(local_1c.value != AVar1.value) * 2 - iVar2) + iVar3 + -2;
}

Assistant:

Am_Define_Formula(int, v_scroll_top)
{
  Am_Object group = self.Get_Owner();
  int group_border = get_scroll_border_thickness(group);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int scroll_border = (look == Am_MOTIF_LOOK) ? 2 : 0;
  int ret = (int)group.Get(Am_CLIP_TOP) - scroll_border - group_border;
  return ret;
}